

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingC.c
# Opt level: O3

char * cmsysEncoding_DupToNarrow(wchar_t *str)

{
  size_t sVar1;
  char *__s;
  
  if (str != (wchar_t *)0x0) {
    sVar1 = wcstombs((char *)0x0,str,0);
    sVar1 = sVar1 + 1;
    if (sVar1 == 0) {
      return (char *)0x0;
    }
    __s = (char *)malloc(sVar1);
    if (__s != (char *)0x0) {
      *__s = '\0';
      wcstombs(__s,str,sVar1);
      return __s;
    }
  }
  return (char *)0x0;
}

Assistant:

size_t kwsysEncoding_wcstombs(char* dest, const wchar_t* str, size_t n)
{
  if (str == 0) {
    return (size_t)-1;
  }
#ifdef _WIN32
  return WideCharToMultiByte(KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str, -1, dest,
                             (int)n, NULL, NULL) -
    1;
#else
  return wcstombs(dest, str, n);
#endif
}